

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_joystick.cpp
# Opt level: O0

void __thiscall SDLInputJoystickManager::SDLInputJoystickManager(SDLInputJoystickManager *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  SDLInputJoystick *this_00;
  SDLInputJoystick *local_30;
  SDLInputJoystick *device;
  int local_14;
  SDLInputJoystickManager *pSStack_10;
  int i;
  SDLInputJoystickManager *this_local;
  
  pSStack_10 = this;
  TArray<SDLInputJoystick_*,_SDLInputJoystick_*>::TArray(&this->Joysticks);
  for (local_14 = 0; iVar1 = local_14, iVar3 = SDL_NumJoysticks(), iVar1 < iVar3;
      local_14 = local_14 + 1) {
    this_00 = (SDLInputJoystick *)operator_new(0x38);
    SDLInputJoystick::SDLInputJoystick(this_00,local_14);
    local_30 = this_00;
    bVar2 = SDLInputJoystick::IsValid(this_00);
    if (bVar2) {
      TArray<SDLInputJoystick_*,_SDLInputJoystick_*>::Push(&this->Joysticks,&local_30);
    }
    else if (local_30 != (SDLInputJoystick *)0x0) {
      (*(local_30->super_IJoystickConfig)._vptr_IJoystickConfig[1])();
    }
  }
  return;
}

Assistant:

SDLInputJoystickManager()
	{
		for(int i = 0;i < SDL_NumJoysticks();i++)
		{
			SDLInputJoystick *device = new SDLInputJoystick(i);
			if(device->IsValid())
				Joysticks.Push(device);
			else
				delete device;
		}
	}